

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdebug.cpp
# Opt level: O0

void __thiscall QDebug::putByteArray(QDebug *this,char *begin,size_t length,Latin1Content content)

{
  long lVar1;
  QStringView string_00;
  pointer str;
  int in_ECX;
  QStringView *in_RDI;
  long in_FS_OFFSET;
  QDebugStateSaver saver;
  QString string;
  Params *in_stack_ffffffffffffff80;
  undefined1 isUnicode;
  QTextStreamPrivate *in_stack_ffffffffffffff98;
  QDebugStateSaver *in_stack_ffffffffffffffa0;
  undefined4 in_stack_ffffffffffffffa8;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  if ((*(byte *)(in_RDI->m_size + 0x31) & 1) == 0) {
    QDebugStateSaver::QDebugStateSaver
              (in_stack_ffffffffffffffa0,(QDebug *)in_stack_ffffffffffffff98);
    isUnicode = (undefined1)((ulong)in_RDI >> 0x38);
    std::unique_ptr<QTextStreamPrivate,_std::default_delete<QTextStreamPrivate>_>::operator->
              ((unique_ptr<QTextStreamPrivate,_std::default_delete<QTextStreamPrivate>_> *)0x277fc7)
    ;
    QTextStreamPrivate::Params::reset(in_stack_ffffffffffffff80);
    std::unique_ptr<QTextStreamPrivate,_std::default_delete<QTextStreamPrivate>_>::get
              ((unique_ptr<QTextStreamPrivate,_std::default_delete<QTextStreamPrivate>_> *)
               in_stack_ffffffffffffff80);
    putEscapedString<unsigned_char>
              ((QTextStreamPrivate *)CONCAT44(in_ECX,in_stack_ffffffffffffffa8),
               (uchar *)in_stack_ffffffffffffffa0,(size_t)in_stack_ffffffffffffff98,(bool)isUnicode)
    ;
    QDebugStateSaver::~QDebugStateSaver((QDebugStateSaver *)in_stack_ffffffffffffff80);
  }
  else {
    if (in_ECX == 1) {
      QString::fromLatin1((char *)in_stack_ffffffffffffffa0,(qsizetype)in_stack_ffffffffffffff98);
    }
    else {
      QString::fromUtf8((char *)in_stack_ffffffffffffffa0,(qsizetype)in_stack_ffffffffffffff98);
    }
    str = std::unique_ptr<QTextStreamPrivate,_std::default_delete<QTextStreamPrivate>_>::operator->
                    ((unique_ptr<QTextStreamPrivate,_std::default_delete<QTextStreamPrivate>_> *)
                     0x277f3c);
    QStringView::QStringView<QString,_true>(in_RDI,(QString *)str);
    string_00.m_data._0_4_ = in_stack_ffffffffffffffa8;
    string_00.m_size = (qsizetype)in_stack_ffffffffffffffa0;
    string_00.m_data._4_4_ = in_ECX;
    QTextStreamPrivate::putString
              (in_stack_ffffffffffffff98,string_00,SUB81((ulong)in_RDI >> 0x38,0));
    QString::~QString((QString *)0x277f72);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QDebug::putByteArray(const char *begin, size_t length, Latin1Content content)
{
    if (stream->noQuotes) {
        // no quotes, write the string directly too (no pretty-printing)
        // this respects the QTextStream state, though
        QString string = content == ContainsLatin1 ? QString::fromLatin1(begin, qsizetype(length))
                                                   : QString::fromUtf8(begin, qsizetype(length));
        stream->ts.d_ptr->putString(string);
    } else {
        // we'll reset the QTextStream formatting mechanisms, so save the state
        QDebugStateSaver saver(*this);
        stream->ts.d_ptr->params.reset();
        putEscapedString(stream->ts.d_ptr.get(), reinterpret_cast<const uchar *>(begin),
                         length, content == ContainsLatin1);
    }
}